

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_setTimeout(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSRuntime *rt_00;
  list_head *opaque;
  int64_t iVar2;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue JVar4;
  JSValue obj;
  JSOSTimer *th;
  JSValue func;
  int64_t delay;
  JSThreadState *ts;
  JSRuntime *rt;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  JSContext *in_stack_ffffffffffffff60;
  list_head *el;
  JSValue in_stack_ffffffffffffff68;
  JSValueUnion JVar5;
  JSValueUnion ctx_00;
  undefined1 in_stack_ffffffffffffff78 [16];
  int64_t iVar6;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  long local_50;
  JSValueUnion local_10;
  int64_t local_8;
  
  rt_00 = JS_GetRuntime(in_RDI);
  JS_GetRuntimeOpaque(rt_00);
  JVar4 = *in_R8;
  iVar1 = JS_IsFunction(in_RDI,*in_R8);
  if (iVar1 == 0) {
    _local_10 = JS_ThrowTypeError(in_RDI,"not a function");
  }
  else {
    JVar3.tag = in_stack_ffffffffffffff90;
    JVar3.u.float64 = in_stack_ffffffffffffff88.float64;
    iVar1 = JS_ToInt64(in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_,JVar3);
    if (iVar1 == 0) {
      JVar3 = JS_NewObjectClass(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      JVar5 = JVar3.u;
      iVar6 = JVar3.tag;
      ctx_00 = JVar5;
      iVar1 = JS_IsException(JVar3);
      if (iVar1 == 0) {
        opaque = (list_head *)js_mallocz((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff68.tag);
        if (opaque == (list_head *)0x0) {
          JS_FreeValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
          local_10.ptr = (void *)(local_10 << 0x20);
          local_8 = 6;
        }
        else {
          *(undefined4 *)&opaque[1].prev = 1;
          iVar2 = get_time_ms();
          opaque[1].next = (list_head *)(iVar2 + local_50);
          el = opaque;
          JVar4 = JS_DupValue(in_RDI,JVar4);
          *(JSValueUnion *)(el + 2) = JVar4.u;
          el[2].next = (list_head *)JVar4.tag;
          list_add_tail(el,(list_head *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          JVar4.tag = iVar6;
          JVar4.u.ptr = JVar5.ptr;
          JS_SetOpaque(JVar4,opaque);
          local_8 = iVar6;
          local_10.ptr = JVar5.ptr;
        }
      }
      else {
        local_8 = iVar6;
        local_10.ptr = JVar5.ptr;
      }
    }
    else {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_os_setTimeout(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    int64_t delay;
    JSValueConst func;
    JSOSTimer *th;
    JSValue obj;

    func = argv[0];
    if (!JS_IsFunction(ctx, func))
        return JS_ThrowTypeError(ctx, "not a function");
    if (JS_ToInt64(ctx, &delay, argv[1]))
        return JS_EXCEPTION;
    obj = JS_NewObjectClass(ctx, js_os_timer_class_id);
    if (JS_IsException(obj))
        return obj;
    th = js_mallocz(ctx, sizeof(*th));
    if (!th) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    th->has_object = TRUE;
    th->timeout = get_time_ms() + delay;
    th->func = JS_DupValue(ctx, func);
    list_add_tail(&th->link, &ts->os_timers);
    JS_SetOpaque(obj, th);
    return obj;
}